

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)3>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  pointer pdVar5;
  pointer piVar6;
  double dVar7;
  double dVar8;
  pointer piVar9;
  uint new_stride;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  long lVar14;
  size_type __n;
  long lVar15;
  long lVar16;
  bool bVar17;
  ulong uVar18;
  pointer pdVar19;
  double *pdVar20;
  long lVar21;
  int i_2;
  ulong uVar22;
  size_t sVar23;
  int local_1f0;
  long local_1e8;
  Data2D<double> vals;
  vector<bool,_std::allocator<bool>_> used;
  SplitDirections split;
  vector<int,_std::allocator<int>_> levels;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<double,_std::allocator<double>_> norm;
  vector<double,_std::allocator<double>_> default_scale;
  Data2D<int> dagUp;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)(int)uVar1;
  sVar23 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  dagUp.stride = CONCAT44(dagUp.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&split.job_directions,sVar23 * __n,(value_type_conflict3 *)&dagUp,
             (allocator_type *)&used);
  piVar9 = split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar23;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&split);
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    getNormalization(&norm,this);
    if (output == -1) {
      new_stride = (this->super_BaseCanonicalGrid).num_outputs;
    }
    else {
      new_stride = 1;
    }
    lVar11 = (long)(int)new_stride;
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (scale_correction == (double *)0x0) {
      dagUp.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&split,lVar11 * __n,
                 (value_type_conflict2 *)&dagUp,(allocator_type *)&used);
      ::std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((vector<double,_std::allocator<double>_> *)&default_scale,&split);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&split);
      scale_correction =
           default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (criteria < refine_direction_selective) {
      uVar22 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar22 = 0;
      }
      lVar15 = 0;
      pdVar20 = scale_correction;
      for (uVar13 = 0; uVar13 != uVar22; uVar13 = uVar13 + 1) {
        sVar4 = (this->surpluses).stride;
        pdVar5 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (output == -1) {
          uVar1 = (this->super_BaseCanonicalGrid).num_outputs;
          uVar12 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar12 = 0;
          }
          bVar17 = true;
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            if (bVar17) {
              bVar17 = (ABS(*(double *)((long)pdVar5 + uVar18 * 8 + sVar4 * lVar15)) *
                       pdVar20[uVar18]) /
                       norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18] <= tolerance;
            }
            else {
              bVar17 = false;
            }
          }
          if (!bVar17) goto LAB_001addd0;
        }
        else if (tolerance <
                 (ABS(pdVar5[sVar4 * uVar13 + (long)output]) * scale_correction[uVar13 * lVar11]) /
                 norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[output]) {
LAB_001addd0:
          split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(split.job_directions.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
          ::std::__fill_n_a<int*,int,int>
                    (piVar9 + uVar13 * sVar23,(this->super_BaseCanonicalGrid).num_dimensions,&split)
          ;
        }
        lVar15 = lVar15 + 8;
        pdVar20 = pdVar20 + lVar11;
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&dagUp,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&split,mset);
      iVar10 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&split);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&global_to_pnts,__n,(allocator_type *)&used);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&levels,(long)iVar10,(allocator_type *)&used);
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      uVar1 = new_stride;
      if ((int)new_stride < 1) {
        uVar1 = 0;
      }
      for (lVar15 = 0;
          lVar15 < (int)(((long)split.job_pnts.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)split.job_pnts.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          lVar15 = lVar15 + 1) {
        lVar21 = (long)split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15];
        piVar6 = split.job_pnts.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        uVar22 = (ulong)((long)split.job_pnts.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar15].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar6) >> 2;
        iVar10 = (int)uVar22;
        Data2D<double>::Data2D<int,int>(&vals,new_stride,iVar10);
        uVar22 = uVar22 & 0xffffffff;
        if (iVar10 < 1) {
          uVar22 = 0;
        }
        if (output == -1) {
          local_1f0 = 0;
          for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
            lVar14 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar14) {
              memmove(vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + vals.stride * uVar13,
                      (this->super_BaseCanonicalGrid).values.values.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (long)piVar6[uVar13] * (this->super_BaseCanonicalGrid).values.num_outputs,
                      lVar14 << 3);
            }
            global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[piVar6[uVar13]] = (int)uVar13;
            iVar10 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)3>
                               ((this->super_BaseCanonicalGrid).points.indexes.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(long)piVar6[uVar13] *
                                 (this->super_BaseCanonicalGrid).points.num_dimensions + lVar21]);
            levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13] = iVar10;
            if (local_1f0 <= iVar10) {
              local_1f0 = iVar10;
            }
          }
        }
        else {
          local_1f0 = 0;
          for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
            iVar10 = piVar6[uVar13];
            vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[vals.stride * uVar13] =
                 (this->super_BaseCanonicalGrid).values.values.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[(this->super_BaseCanonicalGrid).values.num_outputs * (long)iVar10 +
                           (long)output];
            global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar10] = (int)uVar13;
            iVar10 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)3>
                               ((this->super_BaseCanonicalGrid).points.indexes.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(long)piVar6[uVar13] *
                                 (this->super_BaseCanonicalGrid).points.num_dimensions + lVar21]);
            levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13] = iVar10;
            if (local_1f0 <= iVar10) {
              local_1f0 = iVar10;
            }
          }
        }
        if (local_1f0 < 1) {
          local_1f0 = 0;
        }
        for (iVar10 = 1; iVar10 != local_1f0 + 1; iVar10 = iVar10 + 1) {
          local_1e8 = 0;
          for (uVar13 = 0; uVar13 != uVar22; uVar13 = uVar13 + 1) {
            if (levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar13] == iVar10) {
              dVar7 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)3>
                                ((this->super_BaseCanonicalGrid).points.indexes.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start
                                 [(long)piVar6[uVar13] *
                                  (this->super_BaseCanonicalGrid).points.num_dimensions + lVar21]);
              pdVar5 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar14 = (long)piVar6[uVar13] * dagUp.stride;
              lVar16 = vals.stride * local_1e8;
              while (lVar14 = (long)dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar14 + lVar21], lVar14 != -1)
              {
                dVar8 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                  (this->order,
                                   (this->super_BaseCanonicalGrid).points.indexes.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [(this->super_BaseCanonicalGrid).points.num_dimensions * lVar14 +
                                    lVar21],dVar7);
                iVar2 = global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14];
                for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
                  *(double *)((long)pdVar5 + uVar12 * 8 + lVar16) =
                       vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar2 * vals.stride + uVar12] * -dVar8
                       + *(double *)((long)pdVar5 + uVar12 * 8 + lVar16);
                }
                lVar14 = lVar14 * dagUp.stride;
              }
            }
            local_1e8 = local_1e8 + 8;
          }
        }
        sVar4 = (this->surpluses).stride;
        pdVar5 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar19 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar13 = 0; uVar13 != uVar22; uVar13 = uVar13 + 1) {
          lVar16 = (long)piVar6[uVar13];
          lVar14 = sVar4 * lVar16;
          if (output == -1) {
            uVar3 = (this->super_BaseCanonicalGrid).num_outputs;
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            bVar17 = true;
            for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
              if (bVar17 == false) {
                bVar17 = false;
              }
              else {
                dVar7 = (scale_correction + lVar16 * lVar11)[uVar12];
                bVar17 = true;
                if (tolerance <
                    (ABS(pdVar5[lVar14 + uVar12]) * dVar7) /
                    norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12]) {
                  bVar17 = (dVar7 * ABS(pdVar19[uVar12])) /
                           norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12] <= tolerance;
                }
              }
            }
          }
          else {
            dVar7 = scale_correction[lVar16 * lVar11];
            bVar17 = true;
            if (tolerance <
                (ABS(pdVar5[lVar14 + output]) * dVar7) /
                norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[output]) {
              bVar17 = (dVar7 * ABS(vals.vec.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[vals.stride * uVar13]))
                       / norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[output] <= tolerance;
            }
          }
          piVar9[lVar21 + lVar16 * sVar23] = (uint)(bVar17 ^ 1);
          pdVar19 = pdVar19 + vals.stride;
        }
        ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&vals.vec.super__Vector_base<double,_std::allocator<double>_>);
      }
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&used);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&levels);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&global_to_pnts);
      HierarchyManipulations::SplitDirections::~SplitDirections(&split);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dagUp.vec.super__Vector_base<int,_std::allocator<int>_>);
    }
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&default_scale);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&norm);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}